

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t FSE_buildDTable_raw(FSE_DTable *dt,uint nbBits)

{
  uint local_50;
  uint s;
  uint maxSV1;
  uint tableMask;
  uint tableSize;
  FSE_decode_t *dinfo;
  void *dPtr;
  FSE_DTableHeader *DTableH;
  void *ptr;
  uint nbBits_local;
  FSE_DTable *dt_local;
  
  if (nbBits == 0) {
    dt_local = (FSE_DTable *)0xffffffffffffffff;
  }
  else {
    *(short *)dt = (short)nbBits;
    *(undefined2 *)((long)dt + 2) = 1;
    for (local_50 = 0; local_50 < (uint)(1 << ((byte)nbBits & 0x1f)); local_50 = local_50 + 1) {
      *(undefined2 *)(dt + (ulong)local_50 + 1) = 0;
      *(char *)((long)dt + (ulong)local_50 * 4 + 6) = (char)local_50;
      *(byte *)((long)dt + (ulong)local_50 * 4 + 7) = (byte)nbBits;
    }
    dt_local = (FSE_DTable *)0x0;
  }
  return (size_t)dt_local;
}

Assistant:

size_t FSE_buildDTable_raw (FSE_DTable* dt, unsigned nbBits)
{
    void* ptr = dt;
    FSE_DTableHeader* const DTableH = (FSE_DTableHeader*)ptr;
    void* dPtr = dt + 1;
    FSE_decode_t* const dinfo = (FSE_decode_t*)dPtr;
    const unsigned tableSize = 1 << nbBits;
    const unsigned tableMask = tableSize - 1;
    const unsigned maxSV1 = tableMask+1;
    unsigned s;

    /* Sanity checks */
    if (nbBits < 1) return ERROR(GENERIC);         /* min size */

    /* Build Decoding Table */
    DTableH->tableLog = (U16)nbBits;
    DTableH->fastMode = 1;
    for (s=0; s<maxSV1; s++) {
        dinfo[s].newState = 0;
        dinfo[s].symbol = (BYTE)s;
        dinfo[s].nbBits = (BYTE)nbBits;
    }

    return 0;
}